

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O3

void __thiscall
icu_63::RBBITableBuilder::setAdd(RBBITableBuilder *this,UVector *dest,UVector *source)

{
  void **ppvVar1;
  int iVar2;
  uint uVar3;
  void *obj;
  void *pvVar4;
  void *pvVar5;
  void **result;
  void **ppvVar6;
  void **result_00;
  int index;
  long lVar7;
  MaybeStackArray<void_*,_16> sourceArray;
  MaybeStackArray<void_*,_16> destArray;
  MaybeStackArray<void_*,_16> local_150;
  MaybeStackArray<void_*,_16> local_c0;
  
  iVar2 = dest->count;
  lVar7 = (long)iVar2;
  uVar3 = source->count;
  result = local_c0.stackArray;
  local_c0.capacity = 0x10;
  local_c0.needToRelease = '\0';
  local_150.ptr = local_150.stackArray;
  local_150.capacity = 0x10;
  local_150.needToRelease = '\0';
  if (0x10 < lVar7) {
    local_c0.ptr = result;
    result = (void **)uprv_malloc_63(lVar7 * 8);
    if (result == (void **)0x0) goto LAB_002b31cd;
    if (local_c0.needToRelease != '\0') {
      uprv_free_63(local_c0.ptr);
    }
    local_c0.needToRelease = '\x01';
    local_c0.capacity = iVar2;
  }
  local_c0.ptr = result;
  if (local_150.capacity < (int)uVar3) {
    if (((int)uVar3 < 1) ||
       (ppvVar6 = (void **)uprv_malloc_63((ulong)uVar3 * 8), ppvVar6 == (void **)0x0))
    goto LAB_002b31cd;
    if (local_150.needToRelease != '\0') {
      uprv_free_63(local_150.ptr);
    }
    local_150.needToRelease = '\x01';
    local_150.ptr = ppvVar6;
    local_150.capacity = uVar3;
  }
  result_00 = local_150.ptr;
  UVector::toArray(dest,result);
  UVector::toArray(source,result_00);
  UVector::setSize(dest,uVar3 + iVar2,this->fStatus);
  ppvVar6 = result + lVar7;
  ppvVar1 = result_00 + (int)uVar3;
  index = 0;
  if (0 < iVar2 && 0 < (int)uVar3) {
    index = 0;
    do {
      obj = *result_00;
      if (*result == obj) {
        UVector::setElementAt(dest,obj,index);
        result_00 = result_00 + 1;
LAB_002b3150:
        result = result + 1;
      }
      else {
        pvVar4 = *result;
        pvVar5 = *result_00;
        if (((ulong)pvVar4 >> 0x38 | ((ulong)pvVar4 & 0xff000000000000) >> 0x28 |
             ((ulong)pvVar4 & 0xff0000000000) >> 0x18 | ((ulong)pvVar4 & 0xff00000000) >> 8 |
             ((ulong)pvVar4 & 0xff000000) << 8 | ((ulong)pvVar4 & 0xff0000) << 0x18 |
             ((ulong)pvVar4 & 0xff00) << 0x28 | (long)pvVar4 << 0x38) <
            ((ulong)pvVar5 >> 0x38 | ((ulong)pvVar5 & 0xff000000000000) >> 0x28 |
             ((ulong)pvVar5 & 0xff0000000000) >> 0x18 | ((ulong)pvVar5 & 0xff00000000) >> 8 |
             ((ulong)pvVar5 & 0xff000000) << 8 | ((ulong)pvVar5 & 0xff0000) << 0x18 |
             ((ulong)pvVar5 & 0xff00) << 0x28 | (long)pvVar5 << 0x38)) {
          UVector::setElementAt(dest,*result,index);
          goto LAB_002b3150;
        }
        UVector::setElementAt(dest,obj,index);
        result_00 = result_00 + 1;
      }
      index = index + 1;
    } while ((result_00 < ppvVar1) && (result < ppvVar6));
  }
  for (; result < ppvVar6; result = result + 1) {
    UVector::setElementAt(dest,*result,index);
    index = index + 1;
  }
  for (; result_00 < ppvVar1; result_00 = result_00 + 1) {
    UVector::setElementAt(dest,*result_00,index);
    index = index + 1;
  }
  UVector::setSize(dest,index,this->fStatus);
LAB_002b31cd:
  MaybeStackArray<void_*,_16>::~MaybeStackArray(&local_150);
  MaybeStackArray<void_*,_16>::~MaybeStackArray(&local_c0);
  return;
}

Assistant:

void RBBITableBuilder::setAdd(UVector *dest, UVector *source) {
    int32_t destOriginalSize = dest->size();
    int32_t sourceSize       = source->size();
    int32_t di           = 0;
    MaybeStackArray<void *, 16> destArray, sourceArray;  // Handle small cases without malloc
    void **destPtr, **sourcePtr;
    void **destLim, **sourceLim;

    if (destOriginalSize > destArray.getCapacity()) {
        if (destArray.resize(destOriginalSize) == NULL) {
            return;
        }
    }
    destPtr = destArray.getAlias();
    destLim = destPtr + destOriginalSize;  // destArray.getArrayLimit()?

    if (sourceSize > sourceArray.getCapacity()) {
        if (sourceArray.resize(sourceSize) == NULL) {
            return;
        }
    }
    sourcePtr = sourceArray.getAlias();
    sourceLim = sourcePtr + sourceSize;  // sourceArray.getArrayLimit()?

    // Avoid multiple "get element" calls by getting the contents into arrays
    (void) dest->toArray(destPtr);
    (void) source->toArray(sourcePtr);

    dest->setSize(sourceSize+destOriginalSize, *fStatus);

    while (sourcePtr < sourceLim && destPtr < destLim) {
        if (*destPtr == *sourcePtr) {
            dest->setElementAt(*sourcePtr++, di++);
            destPtr++;
        }
        // This check is required for machines with segmented memory, like i5/OS.
        // Direct pointer comparison is not recommended.
        else if (uprv_memcmp(destPtr, sourcePtr, sizeof(void *)) < 0) {
            dest->setElementAt(*destPtr++, di++);
        }
        else { /* *sourcePtr < *destPtr */
            dest->setElementAt(*sourcePtr++, di++);
        }
    }

    // At most one of these two cleanup loops will execute
    while (destPtr < destLim) {
        dest->setElementAt(*destPtr++, di++);
    }
    while (sourcePtr < sourceLim) {
        dest->setElementAt(*sourcePtr++, di++);
    }

    dest->setSize(di, *fStatus);
}